

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O3

void ssh2_channel_try_eof(ssh2_channel *c)

{
  ssh2_connection_state *psVar1;
  size_t sVar2;
  PktOut *pPVar3;
  
  if (c->pending_eof == false) {
    __assert_fail("c->pending_eof",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2.c"
                  ,0x445,"void ssh2_channel_try_eof(struct ssh2_channel *)");
  }
  if (c->halfopen == false) {
    psVar1 = c->connlayer;
    sVar2 = bufchain_size(&c->outbuffer);
    if (sVar2 == 0) {
      sVar2 = bufchain_size(&c->errbuffer);
      if (sVar2 == 0) {
        c->pending_eof = false;
        pPVar3 = (*((psVar1->ppl).bpp)->vt->new_pktout)(0x60);
        BinarySink_put_uint32(pPVar3->binarysink_,(ulong)c->remoteid);
        pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar3->qnode);
        *(byte *)&c->closes = (byte)c->closes | 1;
        ssh2_channel_check_close(c);
        return;
      }
    }
  }
  return;
}

Assistant:

static void ssh2_channel_try_eof(struct ssh2_channel *c)
{
    struct ssh2_connection_state *s = c->connlayer;
    PktOut *pktout;
    assert(c->pending_eof);          /* precondition for calling us */
    if (c->halfopen)
        return;                 /* can't close: not even opened yet */
    if (bufchain_size(&c->outbuffer) > 0 || bufchain_size(&c->errbuffer) > 0)
        return;              /* can't send EOF: pending outgoing data */

    c->pending_eof = false;            /* we're about to send it */

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_CHANNEL_EOF);
    put_uint32(pktout, c->remoteid);
    pq_push(s->ppl.out_pq, pktout);
    c->closes |= CLOSES_SENT_EOF;
    ssh2_channel_check_close(c);
}